

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi__pnm_load(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int iVar1;
  stbi__context *local_40;
  stbi_uc *out;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  iVar1 = stbi__pnm_info(s,(int *)s,(int *)&s->img_y,&s->img_n);
  if (iVar1 == 0) {
    s_local = (stbi__context *)0x0;
  }
  else {
    *x = s->img_x;
    *y = s->img_y;
    *comp = s->img_n;
    local_40 = (stbi__context *)stbi__malloc((ulong)(s->img_n * s->img_x * s->img_y));
    if (local_40 == (stbi__context *)0x0) {
      stbi__err("outofmem");
      s_local = (stbi__context *)0x0;
    }
    else {
      stbi__getn(s,(stbi_uc *)local_40,s->img_n * s->img_x * s->img_y);
      if (((req_comp == 0) || (req_comp == s->img_n)) ||
         (local_40 = (stbi__context *)
                     stbi__convert_format((uchar *)local_40,s->img_n,req_comp,s->img_x,s->img_y),
         s_local = local_40, local_40 != (stbi__context *)0x0)) {
        s_local = local_40;
      }
    }
  }
  return (stbi_uc *)s_local;
}

Assistant:

static stbi_uc *stbi__pnm_load(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   stbi_uc *out;
   if (!stbi__pnm_info(s, (int *)&s->img_x, (int *)&s->img_y, (int *)&s->img_n))
      return 0;
   *x = s->img_x;
   *y = s->img_y;
   *comp = s->img_n;

   out = (stbi_uc *) stbi__malloc(s->img_n * s->img_x * s->img_y);
   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   stbi__getn(s, out, s->img_n * s->img_x * s->img_y);

   if (req_comp && req_comp != s->img_n) {
      out = stbi__convert_format(out, s->img_n, req_comp, s->img_x, s->img_y);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }
   return out;
}